

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cc
# Opt level: O0

uint32_t leveldb::crc32c::Extend(uint32_t crc,char *buf,size_t size)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *puVar6;
  int c_6;
  uint32_t c_5;
  uint32_t c_4;
  uint32_t c_3;
  uint32_t c_2;
  uint32_t c_1;
  int c;
  uint8_t *x;
  uintptr_t pval;
  uint32_t l;
  uint8_t *e;
  uint8_t *p;
  size_t size_local;
  char *buf_local;
  uint32_t crc_local;
  
  puVar6 = (uint8_t *)(buf + size);
  pval._4_4_ = crc ^ 0xffffffff;
  e = (uint8_t *)buf;
  if ((uint8_t *)((ulong)(buf + 3) & 0xfffffffffffffffc) <= puVar6) {
    for (; e != (uint8_t *)((ulong)(buf + 3) & 0xfffffffffffffffc); e = e + 1) {
      pval._4_4_ = *(uint *)(table0_ + (long)(int)(pval._4_4_ & 0xff ^ (uint)*e) * 4) ^
                   pval._4_4_ >> 8;
    }
  }
  for (; 0xf < (long)puVar6 - (long)e; e = e + 0x10) {
    uVar3 = LE_LOAD32(e);
    uVar4 = pval._4_4_ ^ uVar3;
    uVar5 = *(uint *)(table3_ + (ulong)(uVar4 & 0xff) * 4);
    uVar1 = *(uint *)(table2_ + (ulong)(uVar4 >> 8 & 0xff) * 4);
    uVar2 = *(uint *)(table1_ + (ulong)(uVar4 >> 0x10 & 0xff) * 4);
    uVar4 = *(uint *)(table0_ + (ulong)(uVar4 >> 0x18) * 4);
    uVar3 = LE_LOAD32(e + 4);
    uVar4 = uVar5 ^ uVar1 ^ uVar2 ^ uVar4 ^ uVar3;
    uVar5 = *(uint *)(table3_ + (ulong)(uVar4 & 0xff) * 4);
    uVar1 = *(uint *)(table2_ + (ulong)(uVar4 >> 8 & 0xff) * 4);
    uVar2 = *(uint *)(table1_ + (ulong)(uVar4 >> 0x10 & 0xff) * 4);
    uVar4 = *(uint *)(table0_ + (ulong)(uVar4 >> 0x18) * 4);
    uVar3 = LE_LOAD32(e + 8);
    uVar4 = uVar5 ^ uVar1 ^ uVar2 ^ uVar4 ^ uVar3;
    uVar5 = *(uint *)(table3_ + (ulong)(uVar4 & 0xff) * 4);
    uVar1 = *(uint *)(table2_ + (ulong)(uVar4 >> 8 & 0xff) * 4);
    uVar2 = *(uint *)(table1_ + (ulong)(uVar4 >> 0x10 & 0xff) * 4);
    uVar4 = *(uint *)(table0_ + (ulong)(uVar4 >> 0x18) * 4);
    uVar3 = LE_LOAD32(e + 0xc);
    uVar5 = uVar5 ^ uVar1 ^ uVar2 ^ uVar4 ^ uVar3;
    pval._4_4_ = *(uint *)(table3_ + (ulong)(uVar5 & 0xff) * 4) ^
                 *(uint *)(table2_ + (ulong)(uVar5 >> 8 & 0xff) * 4) ^
                 *(uint *)(table1_ + (ulong)(uVar5 >> 0x10 & 0xff) * 4) ^
                 *(uint *)(table0_ + (ulong)(uVar5 >> 0x18) * 4);
  }
  for (; 3 < (long)puVar6 - (long)e; e = e + 4) {
    uVar3 = LE_LOAD32(e);
    uVar5 = pval._4_4_ ^ uVar3;
    pval._4_4_ = *(uint *)(table3_ + (ulong)(uVar5 & 0xff) * 4) ^
                 *(uint *)(table2_ + (ulong)(uVar5 >> 8 & 0xff) * 4) ^
                 *(uint *)(table1_ + (ulong)(uVar5 >> 0x10 & 0xff) * 4) ^
                 *(uint *)(table0_ + (ulong)(uVar5 >> 0x18) * 4);
  }
  for (; e != puVar6; e = e + 1) {
    pval._4_4_ = *(uint *)(table0_ + (long)(int)(pval._4_4_ & 0xff ^ (uint)*e) * 4) ^
                 pval._4_4_ >> 8;
  }
  return pval._4_4_ ^ 0xffffffff;
}

Assistant:

uint32_t Extend(uint32_t crc, const char *buf, size_t size) {
            const uint8_t *p = reinterpret_cast<const uint8_t *>(buf);
            const uint8_t *e = p + size;
            uint32_t l = crc ^0xffffffffu;

#define STEP1 do {                              \
    int c = (l & 0xff) ^ *p++;                  \
    l = table0_[c] ^ (l >> 8);                  \
} while (0)
#define STEP4 do {                              \
    uint32_t c = l ^ LE_LOAD32(p);              \
    p += 4;                                     \
    l = table3_[c & 0xff] ^                     \
        table2_[(c >> 8) & 0xff] ^              \
        table1_[(c >> 16) & 0xff] ^             \
        table0_[c >> 24];                       \
} while (0)

            // Point x at first 4-byte aligned byte in string.  This might be
            // just past the end of the string.
            const uintptr_t pval = reinterpret_cast<uintptr_t>(p);
            const uint8_t *x = reinterpret_cast<const uint8_t *>(((pval + 3) >> 2) << 2);
            if (x <= e) {
                // Process bytes until finished or p is 4-byte aligned
                while (p != x) {
                    STEP1;
                }
            }
            // Process bytes 16 at a time
            while ((e - p) >= 16) {
                STEP4;
                STEP4;
                STEP4;
                STEP4;
            }
            // Process bytes 4 at a time
            while ((e - p) >= 4) {
                STEP4;
            }
            // Process the last few bytes
            while (p != e) {
                STEP1;
            }
#undef STEP4
#undef STEP1
            return l ^ 0xffffffffu;
        }